

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * __thiscall
TiXmlDocument::Parse(TiXmlDocument *this,char *p,TiXmlParsingData *prevData,TiXmlEncoding encoding)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  TiXmlNode *node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TiXmlEncoding encoding_00;
  uchar *pU;
  TiXmlCursor local_48;
  char *local_40;
  int local_38;
  
  this->error = false;
  this->errorId = 0;
  TiXmlString::assign(&this->errorDesc,"",0);
  (this->errorLocation).row = 0;
  (this->errorLocation).col = 0;
  if ((p != (char *)0x0) && (*p != '\0')) {
    (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
    (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
    if (prevData == (TiXmlParsingData *)0x0) {
      local_48.row = 0;
      local_48.col = 0;
    }
    else {
      local_48 = prevData->cursor;
    }
    local_38 = this->tabsize;
    (this->super_TiXmlNode).super_TiXmlBase.location = local_48;
    if (encoding == TIXML_ENCODING_UNKNOWN) {
      encoding = TIXML_ENCODING_UNKNOWN;
      if (((*p == -0x11) && (p[1] == -0x45)) && (encoding = TIXML_ENCODING_UNKNOWN, p[2] == -0x41))
      {
        this->useMicrosoftBOM = true;
        encoding = TIXML_ENCODING_UTF8;
      }
    }
    local_40 = p;
    pcVar5 = TiXmlBase::SkipWhiteSpace(p,encoding);
    if (pcVar5 != (char *)0x0) {
      do {
        if ((*pcVar5 == '\0') ||
           (node = TiXmlNode::Identify(&this->super_TiXmlNode,pcVar5,encoding),
           node == (TiXmlNode *)0x0)) goto LAB_001816f5;
        encoding_00 = encoding;
        iVar3 = (*(node->super_TiXmlBase)._vptr_TiXmlBase[3])(node,pcVar5,&local_48);
        TiXmlNode::LinkEndChild(&this->super_TiXmlNode,node);
        if (encoding == TIXML_ENCODING_UNKNOWN) {
          iVar4 = (*(node->super_TiXmlBase)._vptr_TiXmlBase[0xf])(node);
          if (CONCAT44(extraout_var_00,iVar4) == 0) {
            encoding = TIXML_ENCODING_UNKNOWN;
          }
          else {
            iVar4 = (*(node->super_TiXmlBase)._vptr_TiXmlBase[0xf])(node);
            lVar1 = *(long *)(CONCAT44(extraout_var_01,iVar4) + 0x58);
            if (*(char *)(lVar1 + 0x10) == '\0') {
              encoding = TIXML_ENCODING_UTF8;
            }
            else {
              pcVar5 = (char *)(lVar1 + 0x10);
              encoding = TIXML_ENCODING_UTF8;
              bVar2 = TiXmlBase::StringEqual(pcVar5,"UTF-8",true,encoding_00);
              if (!bVar2) {
                bVar2 = TiXmlBase::StringEqual(pcVar5,"UTF8",true,encoding_00);
                encoding = TIXML_ENCODING_LEGACY - bVar2;
              }
            }
          }
        }
        pcVar5 = TiXmlBase::SkipWhiteSpace((char *)CONCAT44(extraout_var,iVar3),encoding);
      } while (pcVar5 != (char *)0x0);
      pcVar5 = (char *)0x0;
LAB_001816f5:
      if ((this->super_TiXmlNode).firstChild != (TiXmlNode *)0x0) {
        return pcVar5;
      }
      goto LAB_001816db;
    }
  }
  encoding = TIXML_ENCODING_UNKNOWN;
LAB_001816db:
  SetError(this,0xc,(char *)0x0,(TiXmlParsingData *)0x0,encoding);
  return (char *)0x0;
}

Assistant:

const char* TiXmlDocument::Parse( const char* p, TiXmlParsingData* prevData, TiXmlEncoding encoding )
{
	ClearError();

	// Parse away, at the document level. Since a document
	// contains nothing but other tags, most of what happens
	// here is skipping white space.
	if ( !p || !*p )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	// Note that, for a document, this needs to come
	// before the while space skip, so that parsing
	// starts from the pointer we are given.
	location.Clear();
	if ( prevData )
	{
		location.row = prevData->cursor.row;
		location.col = prevData->cursor.col;
	}
	else
	{
		location.row = 0;
		location.col = 0;
	}
	TiXmlParsingData data( p, TabSize(), location.row, location.col );
	location = data.Cursor();

	if ( encoding == TIXML_ENCODING_UNKNOWN )
	{
		// Check for the Microsoft UTF-8 lead bytes.
		const unsigned char* pU = (const unsigned char*)p;
		if (	*(pU+0) && *(pU+0) == TIXML_UTF_LEAD_0
			 && *(pU+1) && *(pU+1) == TIXML_UTF_LEAD_1
			 && *(pU+2) && *(pU+2) == TIXML_UTF_LEAD_2 )
		{
			encoding = TIXML_ENCODING_UTF8;
			useMicrosoftBOM = true;
		}
	}

    p = SkipWhiteSpace( p, encoding );
	if ( !p )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return 0;
	}

	while ( p && *p )
	{
		TiXmlNode* node = Identify( p, encoding );
		if ( node )
		{
			p = node->Parse( p, &data, encoding );
			LinkEndChild( node );
		}
		else
		{
			break;
		}

		// Did we get encoding info?
		if (    encoding == TIXML_ENCODING_UNKNOWN
			 && node->ToDeclaration() )
		{
			TiXmlDeclaration* dec = node->ToDeclaration();
			const char* enc = dec->Encoding();
			assert( enc );

			if ( *enc == 0 )
				encoding = TIXML_ENCODING_UTF8;
			else if ( StringEqual( enc, "UTF-8", true, TIXML_ENCODING_UNKNOWN ) )
				encoding = TIXML_ENCODING_UTF8;
			else if ( StringEqual( enc, "UTF8", true, TIXML_ENCODING_UNKNOWN ) )
				encoding = TIXML_ENCODING_UTF8;	// incorrect, but be nice
			else 
				encoding = TIXML_ENCODING_LEGACY;
		}

		p = SkipWhiteSpace( p, encoding );
	}

	// Was this empty?
	if ( !firstChild ) {
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, encoding );
		return 0;
	}

	// All is well.
	return p;
}